

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<void_*>::TPZVec(TPZVec<void_*> *this,int64_t size,void **copy)

{
  int64_t i;
  void **ppvVar1;
  long lVar2;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649368;
  this->fStore = (void **)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<void *>::TPZVec(const int64_t, const T &) [T = void *]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      ppvVar1 = (void **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
      this->fStore = ppvVar1;
    }
    this->fNElements = size;
    this->fNAlloc = size;
    for (lVar2 = 0; size != lVar2; lVar2 = lVar2 + 1) {
      this->fStore[lVar2] = *copy;
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}